

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

double __thiscall uttt::Eval1::operator()(Eval1 *this,IBoard *board)

{
  IPlayer IVar1;
  int iVar2;
  array<short,_9UL> *paVar3;
  long lVar4;
  double dVar5;
  
  iVar2 = IBoard::GetStatus(board);
  if (iVar2 == 0) {
    dVar5 = 0.0;
  }
  else if (iVar2 == -1) {
    paVar3 = &board->micro;
    dVar5 = 0.0;
    for (lVar4 = 0; lVar4 != 0x48; lVar4 = lVar4 + 8) {
      dVar5 = dVar5 + g_eval_micro1[paVar3->_M_elems[0]] *
                      *(double *)((long)g_eval_micro_relative + lVar4);
      paVar3 = (array<short,_9UL> *)(paVar3->_M_elems + 1);
    }
    dVar5 = (double)(board->player * -2 + 3) * (dVar5 + g_eval_macro1[board->macro]);
  }
  else {
    IVar1 = IBoard::GetPlayerToMove(board);
    if (iVar2 == IVar1) {
      dVar5 = 1.79769313486232e+308;
    }
    else {
      dVar5 = -1.79769313486232e+308;
    }
  }
  return dVar5;
}

Assistant:

double
Eval1::operator()(const IBoard &board) const
{
    int status = board.GetStatus();
    if (status == game::Draw)
        return 0.0;
    if (status != game::Undecided)
    {
        if (board.GetPlayerToMove() == status)
            return std::numeric_limits<double>::max();
        return -std::numeric_limits<double>::max();
    }
    double points = 0.0;
    for (int i = 0; i < 9; ++i)
        points += g_eval_micro1[board.micro[i]] * g_eval_micro_relative[i];
    points += g_eval_macro1[board.macro];
    return (-2 * board.player + 3) * points;
}